

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O1

void __thiscall sentencepiece::TrainerSpec::MergeFrom(TrainerSpec *this,TrainerSpec *from)

{
  InternalMetadata *this_00;
  uint32 *puVar1;
  uint uVar2;
  void *pvVar3;
  Rep *pRVar4;
  void **ppvVar5;
  void *pvVar6;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  
  google::protobuf::internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  pvVar3 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    pvVar6 = this_00->ptr_;
    if (((ulong)pvVar6 & 1) == 0) {
      pbVar8 = google::protobuf::internal::InternalMetadata::
               mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
    }
    else {
      pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (((ulong)pvVar6 & 0xfffffffffffffffe) + 8);
    }
    std::__cxx11::string::_M_append
              ((char *)pbVar8,*(ulong *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 8));
  }
  iVar7 = (from->input_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar7 != 0) {
    pRVar4 = (from->input_).super_RepeatedPtrFieldBase.rep_;
    ppvVar5 = google::protobuf::internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->input_).super_RepeatedPtrFieldBase,iVar7);
    google::protobuf::internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
              (&(this->input_).super_RepeatedPtrFieldBase,ppvVar5,pRVar4->elements,iVar7,
               ((this->input_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->input_).super_RepeatedPtrFieldBase.current_size_);
    iVar7 = iVar7 + (this->input_).super_RepeatedPtrFieldBase.current_size_;
    (this->input_).super_RepeatedPtrFieldBase.current_size_ = iVar7;
    pRVar4 = (this->input_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar4->allocated_size < iVar7) {
      pRVar4->allocated_size = iVar7;
    }
  }
  iVar7 = (from->accept_language_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar7 != 0) {
    pRVar4 = (from->accept_language_).super_RepeatedPtrFieldBase.rep_;
    ppvVar5 = google::protobuf::internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->accept_language_).super_RepeatedPtrFieldBase,iVar7);
    google::protobuf::internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
              (&(this->accept_language_).super_RepeatedPtrFieldBase,ppvVar5,pRVar4->elements,iVar7,
               ((this->accept_language_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->accept_language_).super_RepeatedPtrFieldBase.current_size_);
    iVar7 = iVar7 + (this->accept_language_).super_RepeatedPtrFieldBase.current_size_;
    (this->accept_language_).super_RepeatedPtrFieldBase.current_size_ = iVar7;
    pRVar4 = (this->accept_language_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar4->allocated_size < iVar7) {
      pRVar4->allocated_size = iVar7;
    }
  }
  iVar7 = (from->control_symbols_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar7 != 0) {
    pRVar4 = (from->control_symbols_).super_RepeatedPtrFieldBase.rep_;
    ppvVar5 = google::protobuf::internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->control_symbols_).super_RepeatedPtrFieldBase,iVar7);
    google::protobuf::internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
              (&(this->control_symbols_).super_RepeatedPtrFieldBase,ppvVar5,pRVar4->elements,iVar7,
               ((this->control_symbols_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->control_symbols_).super_RepeatedPtrFieldBase.current_size_);
    iVar7 = iVar7 + (this->control_symbols_).super_RepeatedPtrFieldBase.current_size_;
    (this->control_symbols_).super_RepeatedPtrFieldBase.current_size_ = iVar7;
    pRVar4 = (this->control_symbols_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar4->allocated_size < iVar7) {
      pRVar4->allocated_size = iVar7;
    }
  }
  iVar7 = (from->user_defined_symbols_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar7 != 0) {
    pRVar4 = (from->user_defined_symbols_).super_RepeatedPtrFieldBase.rep_;
    ppvVar5 = google::protobuf::internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->user_defined_symbols_).super_RepeatedPtrFieldBase,iVar7);
    google::protobuf::internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
              (&(this->user_defined_symbols_).super_RepeatedPtrFieldBase,ppvVar5,pRVar4->elements,
               iVar7,((this->user_defined_symbols_).super_RepeatedPtrFieldBase.rep_)->allocated_size
                     - (this->user_defined_symbols_).super_RepeatedPtrFieldBase.current_size_);
    iVar7 = iVar7 + (this->user_defined_symbols_).super_RepeatedPtrFieldBase.current_size_;
    (this->user_defined_symbols_).super_RepeatedPtrFieldBase.current_size_ = iVar7;
    pRVar4 = (this->user_defined_symbols_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar4->allocated_size < iVar7) {
      pRVar4->allocated_size = iVar7;
    }
  }
  uVar2 = (from->_has_bits_).has_bits_[0];
  if ((char)uVar2 != '\0') {
    if ((uVar2 & 1) != 0) {
      pvVar3 = (from->model_prefix_).tagged_ptr_.ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 1;
      pvVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pvVar6 & 1) != 0) {
        pvVar6 = *(void **)((ulong)pvVar6 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set
                (&this->model_prefix_,(ulong)pvVar3 & 0xfffffffffffffffe,pvVar6);
    }
    if ((uVar2 & 2) != 0) {
      pvVar3 = (from->input_format_).tagged_ptr_.ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 2;
      pvVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pvVar6 & 1) != 0) {
        pvVar6 = *(void **)((ulong)pvVar6 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set
                (&this->input_format_,(ulong)pvVar3 & 0xfffffffffffffffe,pvVar6);
    }
    if ((uVar2 & 4) != 0) {
      pvVar3 = (from->required_chars_).tagged_ptr_.ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 4;
      pvVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pvVar6 & 1) != 0) {
        pvVar6 = *(void **)((ulong)pvVar6 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set
                (&this->required_chars_,(ulong)pvVar3 & 0xfffffffffffffffe,pvVar6);
    }
    if ((uVar2 & 8) != 0) {
      pvVar3 = (from->unk_surface_).tagged_ptr_.ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 8;
      pvVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pvVar6 & 1) != 0) {
        pvVar6 = *(void **)((ulong)pvVar6 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set
                (&this->unk_surface_,(ulong)pvVar3 & 0xfffffffffffffffe,pvVar6);
    }
    if ((uVar2 & 0x10) != 0) {
      pvVar3 = (from->unk_piece_).tagged_ptr_.ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 0x10;
      pvVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pvVar6 & 1) != 0) {
        pvVar6 = *(void **)((ulong)pvVar6 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set
                (&this->unk_piece_,(ulong)pvVar3 & 0xfffffffffffffffe,pvVar6);
    }
    if ((uVar2 & 0x20) != 0) {
      pvVar3 = (from->bos_piece_).tagged_ptr_.ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 0x20;
      pvVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pvVar6 & 1) != 0) {
        pvVar6 = *(void **)((ulong)pvVar6 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set
                (&this->bos_piece_,(ulong)pvVar3 & 0xfffffffffffffffe,pvVar6);
    }
    if ((uVar2 & 0x40) != 0) {
      pvVar3 = (from->eos_piece_).tagged_ptr_.ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 0x40;
      pvVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pvVar6 & 1) != 0) {
        pvVar6 = *(void **)((ulong)pvVar6 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set
                (&this->eos_piece_,(ulong)pvVar3 & 0xfffffffffffffffe,pvVar6);
    }
    if ((char)uVar2 < '\0') {
      pvVar3 = (from->pad_piece_).tagged_ptr_.ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 0x80;
      pvVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pvVar6 & 1) != 0) {
        pvVar6 = *(void **)((ulong)pvVar6 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set
                (&this->pad_piece_,(ulong)pvVar3 & 0xfffffffffffffffe,pvVar6);
    }
  }
  if ((uVar2 & 0xff00) != 0) {
    if ((uVar2 >> 8 & 1) != 0) {
      pvVar3 = (from->pretokenization_delimiter_).tagged_ptr_.ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 0x100;
      pvVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pvVar6 & 1) != 0) {
        pvVar6 = *(void **)((ulong)pvVar6 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set
                (&this->pretokenization_delimiter_,(ulong)pvVar3 & 0xfffffffffffffffe,pvVar6);
    }
    if ((uVar2 >> 9 & 1) != 0) {
      pvVar3 = (from->seed_sentencepieces_file_).tagged_ptr_.ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 0x200;
      pvVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pvVar6 & 1) != 0) {
        pvVar6 = *(void **)((ulong)pvVar6 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set
                (&this->seed_sentencepieces_file_,(ulong)pvVar3 & 0xfffffffffffffffe,pvVar6);
    }
    if ((uVar2 >> 10 & 1) != 0) {
      this->self_test_sample_size_ = from->self_test_sample_size_;
    }
    if ((uVar2 >> 0xb & 1) != 0) {
      this->mining_sentence_size_ = from->mining_sentence_size_;
    }
    if ((uVar2 >> 0xc & 1) != 0) {
      this->input_sentence_size_ = from->input_sentence_size_;
    }
    if ((uVar2 >> 0xd & 1) != 0) {
      this->training_sentence_size_ = from->training_sentence_size_;
    }
    if ((uVar2 >> 0xe & 1) != 0) {
      this->enable_differential_privacy_ = from->enable_differential_privacy_;
    }
    if ((short)uVar2 < 0) {
      this->treat_whitespace_as_suffix_ = from->treat_whitespace_as_suffix_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar2;
  }
  if ((uVar2 & 0xff0000) != 0) {
    if ((uVar2 >> 0x10 & 1) != 0) {
      this->allow_whitespace_only_pieces_ = from->allow_whitespace_only_pieces_;
    }
    if ((uVar2 >> 0x11 & 1) != 0) {
      this->split_digits_ = from->split_digits_;
    }
    if ((uVar2 >> 0x12 & 1) != 0) {
      this->byte_fallback_ = from->byte_fallback_;
    }
    if ((uVar2 >> 0x13 & 1) != 0) {
      this->use_all_vocab_ = from->use_all_vocab_;
    }
    if ((uVar2 >> 0x14 & 1) != 0) {
      this->train_extremely_large_corpus_ = from->train_extremely_large_corpus_;
    }
    if ((uVar2 >> 0x15 & 1) != 0) {
      this->unk_id_ = from->unk_id_;
    }
    if ((uVar2 >> 0x16 & 1) != 0) {
      this->differential_privacy_noise_level_ = from->differential_privacy_noise_level_;
    }
    if ((uVar2 >> 0x17 & 1) != 0) {
      this->differential_privacy_clipping_threshold_ =
           from->differential_privacy_clipping_threshold_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar2;
  }
  if (0xffffff < uVar2) {
    if ((uVar2 >> 0x18 & 1) != 0) {
      this->model_type_ = from->model_type_;
    }
    if ((uVar2 >> 0x19 & 1) != 0) {
      this->vocab_size_ = from->vocab_size_;
    }
    if ((uVar2 >> 0x1a & 1) != 0) {
      this->character_coverage_ = from->character_coverage_;
    }
    if ((uVar2 >> 0x1b & 1) != 0) {
      this->seed_sentencepiece_size_ = from->seed_sentencepiece_size_;
    }
    if ((uVar2 >> 0x1c & 1) != 0) {
      this->shrinking_factor_ = from->shrinking_factor_;
    }
    if ((uVar2 >> 0x1d & 1) != 0) {
      this->num_threads_ = from->num_threads_;
    }
    if ((uVar2 >> 0x1e & 1) != 0) {
      this->num_sub_iterations_ = from->num_sub_iterations_;
    }
    if ((int)uVar2 < 0) {
      this->max_sentence_length_ = from->max_sentence_length_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar2;
  }
  uVar2 = (from->_has_bits_).has_bits_[1];
  if ((char)uVar2 != '\0') {
    if ((uVar2 & 1) != 0) {
      this->max_sentencepiece_length_ = from->max_sentencepiece_length_;
    }
    if ((uVar2 & 2) != 0) {
      this->shuffle_input_sentence_ = from->shuffle_input_sentence_;
    }
    if ((uVar2 & 4) != 0) {
      this->split_by_unicode_script_ = from->split_by_unicode_script_;
    }
    if ((uVar2 & 8) != 0) {
      this->split_by_number_ = from->split_by_number_;
    }
    if ((uVar2 & 0x10) != 0) {
      this->split_by_whitespace_ = from->split_by_whitespace_;
    }
    if ((uVar2 & 0x20) != 0) {
      this->vocabulary_output_piece_score_ = from->vocabulary_output_piece_score_;
    }
    if ((uVar2 & 0x40) != 0) {
      this->hard_vocab_limit_ = from->hard_vocab_limit_;
    }
    if ((char)uVar2 < '\0') {
      this->bos_id_ = from->bos_id_;
    }
    puVar1 = (this->_has_bits_).has_bits_ + 1;
    *puVar1 = *puVar1 | uVar2;
  }
  if ((uVar2 & 0x300) != 0) {
    if ((uVar2 >> 8 & 1) != 0) {
      this->eos_id_ = from->eos_id_;
    }
    if ((uVar2 >> 9 & 1) != 0) {
      this->pad_id_ = from->pad_id_;
    }
    puVar1 = (this->_has_bits_).has_bits_ + 1;
    *puVar1 = *puVar1 | uVar2;
  }
  return;
}

Assistant:

void TrainerSpec::MergeFrom(const TrainerSpec& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:sentencepiece.TrainerSpec)
  GOOGLE_DCHECK_NE(&from, this);
  _extensions_.MergeFrom(from._extensions_);
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  input_.MergeFrom(from.input_);
  accept_language_.MergeFrom(from.accept_language_);
  control_symbols_.MergeFrom(from.control_symbols_);
  user_defined_symbols_.MergeFrom(from.user_defined_symbols_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x000000ffu) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_model_prefix(from._internal_model_prefix());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_set_input_format(from._internal_input_format());
    }
    if (cached_has_bits & 0x00000004u) {
      _internal_set_required_chars(from._internal_required_chars());
    }
    if (cached_has_bits & 0x00000008u) {
      _internal_set_unk_surface(from._internal_unk_surface());
    }
    if (cached_has_bits & 0x00000010u) {
      _internal_set_unk_piece(from._internal_unk_piece());
    }
    if (cached_has_bits & 0x00000020u) {
      _internal_set_bos_piece(from._internal_bos_piece());
    }
    if (cached_has_bits & 0x00000040u) {
      _internal_set_eos_piece(from._internal_eos_piece());
    }
    if (cached_has_bits & 0x00000080u) {
      _internal_set_pad_piece(from._internal_pad_piece());
    }
  }
  if (cached_has_bits & 0x0000ff00u) {
    if (cached_has_bits & 0x00000100u) {
      _internal_set_pretokenization_delimiter(from._internal_pretokenization_delimiter());
    }
    if (cached_has_bits & 0x00000200u) {
      _internal_set_seed_sentencepieces_file(from._internal_seed_sentencepieces_file());
    }
    if (cached_has_bits & 0x00000400u) {
      self_test_sample_size_ = from.self_test_sample_size_;
    }
    if (cached_has_bits & 0x00000800u) {
      mining_sentence_size_ = from.mining_sentence_size_;
    }
    if (cached_has_bits & 0x00001000u) {
      input_sentence_size_ = from.input_sentence_size_;
    }
    if (cached_has_bits & 0x00002000u) {
      training_sentence_size_ = from.training_sentence_size_;
    }
    if (cached_has_bits & 0x00004000u) {
      enable_differential_privacy_ = from.enable_differential_privacy_;
    }
    if (cached_has_bits & 0x00008000u) {
      treat_whitespace_as_suffix_ = from.treat_whitespace_as_suffix_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  if (cached_has_bits & 0x00ff0000u) {
    if (cached_has_bits & 0x00010000u) {
      allow_whitespace_only_pieces_ = from.allow_whitespace_only_pieces_;
    }
    if (cached_has_bits & 0x00020000u) {
      split_digits_ = from.split_digits_;
    }
    if (cached_has_bits & 0x00040000u) {
      byte_fallback_ = from.byte_fallback_;
    }
    if (cached_has_bits & 0x00080000u) {
      use_all_vocab_ = from.use_all_vocab_;
    }
    if (cached_has_bits & 0x00100000u) {
      train_extremely_large_corpus_ = from.train_extremely_large_corpus_;
    }
    if (cached_has_bits & 0x00200000u) {
      unk_id_ = from.unk_id_;
    }
    if (cached_has_bits & 0x00400000u) {
      differential_privacy_noise_level_ = from.differential_privacy_noise_level_;
    }
    if (cached_has_bits & 0x00800000u) {
      differential_privacy_clipping_threshold_ = from.differential_privacy_clipping_threshold_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  if (cached_has_bits & 0xff000000u) {
    if (cached_has_bits & 0x01000000u) {
      model_type_ = from.model_type_;
    }
    if (cached_has_bits & 0x02000000u) {
      vocab_size_ = from.vocab_size_;
    }
    if (cached_has_bits & 0x04000000u) {
      character_coverage_ = from.character_coverage_;
    }
    if (cached_has_bits & 0x08000000u) {
      seed_sentencepiece_size_ = from.seed_sentencepiece_size_;
    }
    if (cached_has_bits & 0x10000000u) {
      shrinking_factor_ = from.shrinking_factor_;
    }
    if (cached_has_bits & 0x20000000u) {
      num_threads_ = from.num_threads_;
    }
    if (cached_has_bits & 0x40000000u) {
      num_sub_iterations_ = from.num_sub_iterations_;
    }
    if (cached_has_bits & 0x80000000u) {
      max_sentence_length_ = from.max_sentence_length_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  cached_has_bits = from._has_bits_[1];
  if (cached_has_bits & 0x000000ffu) {
    if (cached_has_bits & 0x00000001u) {
      max_sentencepiece_length_ = from.max_sentencepiece_length_;
    }
    if (cached_has_bits & 0x00000002u) {
      shuffle_input_sentence_ = from.shuffle_input_sentence_;
    }
    if (cached_has_bits & 0x00000004u) {
      split_by_unicode_script_ = from.split_by_unicode_script_;
    }
    if (cached_has_bits & 0x00000008u) {
      split_by_number_ = from.split_by_number_;
    }
    if (cached_has_bits & 0x00000010u) {
      split_by_whitespace_ = from.split_by_whitespace_;
    }
    if (cached_has_bits & 0x00000020u) {
      vocabulary_output_piece_score_ = from.vocabulary_output_piece_score_;
    }
    if (cached_has_bits & 0x00000040u) {
      hard_vocab_limit_ = from.hard_vocab_limit_;
    }
    if (cached_has_bits & 0x00000080u) {
      bos_id_ = from.bos_id_;
    }
    _has_bits_[1] |= cached_has_bits;
  }
  if (cached_has_bits & 0x00000300u) {
    if (cached_has_bits & 0x00000100u) {
      eos_id_ = from.eos_id_;
    }
    if (cached_has_bits & 0x00000200u) {
      pad_id_ = from.pad_id_;
    }
    _has_bits_[1] |= cached_has_bits;
  }
}